

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmaster.c
# Opt level: O2

err_t ReadData(ebml_master *Element,stream *Input,ebml_parser_context *ParserContext,
              bool_t AllowDummyElt,int Scope,size_t DepthCheckCRC)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  size_t sVar4;
  filepos_t fVar5;
  long lVar6;
  ebml_crc *Element_00;
  bool_t bVar7;
  filepos_t fVar8;
  filepos_t fVar9;
  ebml_context *Context_00;
  ebml_crc *peVar10;
  stream *psVar11;
  bool bVar12;
  int UpperEltFound;
  uint8_t *CRCData;
  stream *local_a0;
  bool_t local_98;
  ebml_crc *local_90;
  array local_88;
  size_t local_78;
  filepos_t OffSet;
  int local_64;
  size_t local_60;
  long local_58;
  ebml_parser_context Context;
  
  UpperEltFound = 0;
  CRCData = (uint8_t *)0x0;
  local_98 = AllowDummyElt;
  local_60 = DepthCheckCRC;
  NodeTree_Clear((nodetree *)Element);
  (Element->Base).bValueIsSet = '\0';
  if (((Element->Base).DataSize < 1) &&
     (bVar7 = EBML_ElementIsFiniteSize(&Element->Base), bVar7 != 0)) {
    Element_00 = (ebml_crc *)0x0;
    psVar11 = Input;
  }
  else {
    local_64 = Scope;
    if (Input == (stream *)0x0) {
      __assert_fail("(const void*)(Input)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                    ,0x123,
                    "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                   );
    }
    pcVar2 = *(code **)((long)(Input->Base).VMT + 0x78);
    fVar5 = EBML_ElementPositionData(&Element->Base);
    lVar6 = (*pcVar2)(Input,fVar5,0);
    if (lVar6 == -1) {
      return -9;
    }
    fVar5 = (Element->Base).DataSize;
    Context.Context = (Element->Base).Context;
    Context.UpContext = ParserContext;
    Context.EndPosition = EBML_ElementPositionEnd(&Element->Base);
    Context.Profile = ParserContext->Profile;
    Element_00 = (ebml_crc *)EBML_FindNextElement(Input,&Context,&UpperEltFound,local_98);
    local_90 = (ebml_crc *)0x0;
    local_58 = local_60 - 1;
    if (local_60 == 0) {
      local_58 = 0;
    }
    bVar3 = true;
    local_78 = 0;
    local_a0 = Input;
    while ((Element_00 != (ebml_crc *)0x0 && (UpperEltFound < 1))) {
      bVar7 = EBML_ElementIsFiniteSize(&Element->Base);
      if (bVar7 != 0) {
        fVar8 = EBML_ElementPositionEnd(&Element_00->Base);
        fVar9 = EBML_ElementPositionEnd(&Element->Base);
        if (fVar9 < fVar8) break;
      }
      if ((local_98 == 0) && (bVar7 = EBML_ElementIsDummy(&Element_00->Base), bVar7 != 0)) {
        EBML_ElementSkipData(&Element_00->Base,Input,&Context,(ebml_element *)0x0,0);
        NodeDelete((node *)Element_00);
        Element_00 = (ebml_crc *)0x0;
      }
      else {
        iVar1 = local_64;
        lVar6 = (**(code **)((long)(Element_00->Base).Base.Base.VMT + 0x78))
                          (Element_00,Input,&Context,local_98,local_64,local_58);
        peVar10 = local_90;
        psVar11 = local_a0;
        if (lVar6 == 0) {
          if (((iVar1 == 2) || (local_60 == 0)) || (!bVar3)) {
LAB_001128f3:
            if (peVar10 != Element_00) {
              EBML_MasterAppend(Element,&Element_00->Base);
            }
          }
          else {
            Context_00 = EBML_getContextEbmlCrc32();
            bVar7 = EBML_ElementIsType(&Element_00->Base,Context_00);
            if ((bVar7 == 0) || (peVar10 != (ebml_crc *)0x0)) {
              bVar3 = true;
              goto LAB_001128f3;
            }
            bVar7 = EBML_ElementIsFiniteSize(&Element->Base);
            if (bVar7 == 0) {
              peVar10 = (ebml_crc *)0x0;
              bVar3 = false;
              goto LAB_001128f3;
            }
            bVar7 = Node_IsPartOf(psVar11,0x534d454d);
            peVar10 = Element_00;
            if (bVar7 == 0) {
              local_88._Begin = (char *)0x0;
              local_88._Used = 0;
              fVar5 = EBML_ElementPositionEnd(&Element->Base);
              fVar8 = EBML_ElementPositionEnd(&Element_00->Base);
              if (fVar5 - fVar8 == 0xffffffffffffffff) goto LAB_001128d5;
              bVar7 = ArrayResize(&local_88,fVar5 - fVar8,0);
              sVar4 = local_88._Used;
              bVar3 = false;
              if (bVar7 != 0) {
                CRCData = (uint8_t *)local_88._Begin;
                Input = (stream *)NodeCreate(Element,0x534d454d);
                local_78 = sVar4;
                if (Input != (stream *)0x0) {
                  OffSet = EBML_ElementPositionEnd(&Element_00->Base);
                  (**(code **)((long)(Input->Base).VMT + 0x20))(Input,0x100,CRCData,sVar4);
                  (**(code **)((long)(Input->Base).VMT + 0x20))(Input,0x102,&OffSet);
                  psVar11 = local_a0;
                  pcVar2 = *(code **)((long)(local_a0->Base).VMT + 0x78);
                  fVar5 = EBML_ElementPositionEnd(&Element_00->Base);
                  (*pcVar2)(psVar11,fVar5,0);
                  lVar6 = (**(code **)((long)(psVar11->Base).VMT + 0x58))(psVar11,CRCData,sVar4);
                  if (lVar6 != 0) {
                    StreamClose(Input);
                    ArrayClear(&local_88);
                    CRCData = (uint8_t *)0x0;
                    Input = psVar11;
                    peVar10 = (ebml_crc *)0x0;
                  }
                  bVar3 = false;
                  goto LAB_001128f3;
                }
                ArrayClear(&local_88);
                bVar3 = false;
                Input = local_a0;
              }
            }
            else {
              pcVar2 = *(code **)((long)(psVar11->Base).VMT + 0x78);
              fVar5 = EBML_ElementPositionEnd(&Element_00->Base);
              lVar6 = (*pcVar2)(psVar11,fVar5,0);
              (**(code **)((long)(psVar11->Base).VMT + 0x18))(psVar11,0x102,&OffSet,8);
              (**(code **)((long)(psVar11->Base).VMT + 0x18))(psVar11,0x101,&CRCData);
              CRCData = CRCData + (lVar6 - OffSet);
              fVar5 = EBML_ElementDataSize(&Element->Base,1);
              fVar8 = EBML_ElementFullSize(&Element_00->Base,1);
              local_78 = fVar5 - fVar8;
              (**(code **)((long)(psVar11->Base).VMT + 0x58))(psVar11,CRCData,local_78);
LAB_001128d5:
              bVar3 = false;
            }
          }
          local_90 = peVar10;
          EBML_ElementSkipData(&Element_00->Base,Input,&Context,(ebml_element *)0x0,local_98);
          fVar5 = EBML_ElementPositionEnd(&Element->Base);
          fVar8 = EBML_ElementPositionEnd(&Element_00->Base);
          fVar5 = fVar5 - fVar8;
        }
        else {
          NodeDelete((node *)Element_00);
          Element_00 = (ebml_crc *)0x0;
        }
      }
      if (UpperEltFound < 1) {
        if (((UpperEltFound < 0) && (UpperEltFound = UpperEltFound + 1, UpperEltFound != 0)) ||
           ((bVar7 = EBML_ElementIsFiniteSize(&Element->Base), bVar7 != 0 && (fVar5 < 1)))) break;
        Element_00 = (ebml_crc *)EBML_FindNextElement(Input,&Context,&UpperEltFound,local_98);
      }
      else {
        iVar1 = UpperEltFound + -1;
        bVar12 = UpperEltFound != 1;
        UpperEltFound = iVar1;
        if ((bVar12) ||
           ((bVar7 = EBML_ElementIsFiniteSize(&Element->Base), bVar7 != 0 && (fVar5 < 1)))) break;
      }
    }
    peVar10 = local_90;
    psVar11 = local_a0;
    if (CRCData != (uint8_t *)0x0) {
      bVar7 = EBML_CRCMatches(local_90,CRCData,local_78);
      Element->CheckSumStatus = 2 - (uint)(bVar7 == 0);
      NodeDelete((node *)peVar10);
      psVar11 = local_a0;
      if (CRCData == (uint8_t *)local_88._Begin) {
        StreamClose(Input);
        ArrayClear(&local_88);
      }
    }
  }
  (Element->Base).bValueIsSet = '\x01';
  if (0 < UpperEltFound) {
    if (Element_00 == (ebml_crc *)0x0) {
      __assert_fail("SubElement!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                    ,0x1a0,
                    "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                   );
    }
    if (psVar11 == (stream *)0x0) {
      __assert_fail("(const void*)(Input)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                    ,0x1a1,
                    "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                   );
    }
    (**(code **)((long)(psVar11->Base).VMT + 0x78))(psVar11,(Element_00->Base).ElementPosition,0);
    NodeDelete((node *)Element_00);
  }
  return 0;
}

Assistant:

static err_t ReadData(ebml_master *Element, struct stream *Input, const ebml_parser_context *ParserContext, bool_t AllowDummyElt, int Scope, size_t DepthCheckCRC)
{
    int UpperEltFound = 0;
    bool_t bFirst = 1;
    ebml_element *SubElement = NULL;
    ebml_crc *CRCElement = NULL;
    struct stream *ReadStream = Input;
    array CrcBuffer;
    uint8_t *CRCData = NULL;
    size_t CRCDataSize = 0;

    // remove all existing elements, including the mandatory ones...
    NodeTree_Clear((nodetree*)Element);
    Element->Base.bValueIsSet = 0;

	// read blocks and discard the ones we don't care about
	if (Element->Base.DataSize > 0 || !EBML_ElementIsFiniteSize((ebml_element*)Element)) {
        ebml_parser_context Context;
        filepos_t MaxSizeToRead;

        if (Stream_Seek(Input,EBML_ElementPositionData((ebml_element*)Element),SEEK_SET)==INVALID_FILEPOS_T)
            return ERR_END_OF_FILE;

        MaxSizeToRead = Element->Base.DataSize;
        Context.UpContext = ParserContext;
        Context.Context = Element->Base.Context;
        Context.EndPosition = EBML_ElementPositionEnd((ebml_element*)Element);
        Context.Profile = ParserContext->Profile;
        SubElement = EBML_FindNextElement(Input,&Context,&UpperEltFound,AllowDummyElt);
		while (SubElement && UpperEltFound<=0 && (!EBML_ElementIsFiniteSize((ebml_element*)Element) || EBML_ElementPositionEnd(SubElement) <= EBML_ElementPositionEnd((ebml_element*)Element)))
        {
			if (!AllowDummyElt && EBML_ElementIsDummy(SubElement)) {
                // TODO: this should never happen
                EBML_ElementSkipData(SubElement,ReadStream,&Context,NULL,AllowDummyElt);
				NodeDelete((node*)SubElement); // forget this unknown element
                SubElement = NULL;
			}
            else
            {
                if (EBML_ElementReadData(SubElement,ReadStream,&Context,AllowDummyElt, Scope, DepthCheckCRC?DepthCheckCRC-1:0)==ERR_NONE)
                {
                    if (bFirst && DepthCheckCRC && Scope!=SCOPE_NO_DATA && EBML_ElementIsType(SubElement, EBML_getContextEbmlCrc32()) && CRCElement==NULL)
                    {
                        if (EBML_ElementIsFiniteSize((ebml_element*)Element))
                        {
                            CRCElement = (ebml_crc*)SubElement;
                            if (Node_IsPartOf(Input, MEMSTREAM_CLASS))
                            {
                                filepos_t DataPos = Stream_Seek(Input,EBML_ElementPositionEnd(SubElement),SEEK_SET);
                                filepos_t OffSet;
                                Node_GET(Input,MEMSTREAM_OFFSET,&OffSet);
                                Node_GET(Input,MEMSTREAM_PTR,&CRCData);
                                CRCData += (DataPos - OffSet);
                                CRCDataSize = (size_t)(EBML_ElementDataSize((ebml_element*)Element,1) - EBML_ElementFullSize(SubElement,1));
                                Stream_Read(Input, CRCData, CRCDataSize, NULL);
                            }
                            else
                            {
                                // read the rest of the element in memory to avoid reading it a second time later
                                ArrayInit(&CrcBuffer);
                                filepos_t element_size = EBML_ElementPositionEnd((ebml_element*)Element) - EBML_ElementPositionEnd(SubElement);
#if MAX_FILEPOS >= SIZE_MAX
                                if ((filepos_t)element_size < (filepos_t)SIZE_MAX
#else
                                if ((size_t)element_size < (size_t)SIZE_MAX
#endif
                                    && ArrayResize(&CrcBuffer, (size_t)element_size, 0))
                                {
                                    CRCData = ARRAYBEGIN(CrcBuffer,uint8_t);
                                    CRCDataSize = ARRAYCOUNT(CrcBuffer,uint8_t);
                                    ReadStream = (struct stream*)NodeCreate(Element, MEMSTREAM_CLASS);
                                    if (ReadStream==NULL)
                                    {
                                        ReadStream=Input; // revert back to normal reading
                                        ArrayClear(&CrcBuffer);
                                    }
                                    else
                                    {
                                        filepos_t Offset = EBML_ElementPositionEnd(SubElement);
                                        Node_Set(ReadStream, MEMSTREAM_DATA, CRCData, CRCDataSize);
                                        Node_SET(ReadStream, MEMSTREAM_OFFSET, &Offset);
                                        Stream_Seek(Input,EBML_ElementPositionEnd(SubElement),SEEK_SET);
                                        if (Stream_Read(Input, CRCData, CRCDataSize, NULL)!=ERR_NONE)
                                        {
                                            StreamClose(ReadStream);
                                            ReadStream=Input; // revert back to normal reading
                                            ArrayClear(&CrcBuffer);
                                            CRCData = NULL;
                                            CRCElement = NULL;
                                        }
                                    }
                                }
                            }
                        }
                        bFirst = 0;
                    }
                    if (CRCElement != (ebml_crc*)SubElement)
                        EBML_MasterAppend(Element,SubElement);
			        // just in case
                    EBML_ElementSkipData(SubElement,ReadStream,&Context,NULL,AllowDummyElt);
                }
                else
                {
                    NodeDelete((node*)SubElement);
                    SubElement = NULL;
                }
			}
            if (SubElement)
			    MaxSizeToRead = EBML_ElementPositionEnd((ebml_element*)Element) - EBML_ElementPositionEnd(SubElement); // even if it's the default value

			if (UpperEltFound > 0) {
				UpperEltFound--;
				if (UpperEltFound > 0 || (EBML_ElementIsFiniteSize((ebml_element*)Element) && MaxSizeToRead <= 0))
					goto processCrc;
				continue;
			}

			if (UpperEltFound < 0) {
				UpperEltFound++;
				if (UpperEltFound < 0)
					goto processCrc;
			}

			if (EBML_ElementIsFiniteSize((ebml_element*)Element) && MaxSizeToRead <= 0) {
				goto processCrc;// this level is finished
			}

			SubElement = EBML_FindNextElement(ReadStream,&Context,&UpperEltFound,AllowDummyElt);
		}
	}
processCrc:
    if (CRCData!=NULL)
    {
        Element->CheckSumStatus = EBML_CRCMatches(CRCElement, CRCData, CRCDataSize)?2:1;
        NodeDelete((node*)CRCElement);
        if (CRCData == ARRAYBEGIN(CrcBuffer,uint8_t))
        {
            StreamClose(ReadStream);
            ArrayClear(&CrcBuffer);
        }
    }

    Element->Base.bValueIsSet = 1;
    if (UpperEltFound>0) // move back to the upper element beginning so that the next loop can find it
    {
        assert(SubElement!=NULL);
        Stream_Seek(Input,SubElement->ElementPosition,SEEK_SET);
        NodeDelete((node*)SubElement); // forget about it, it will be read again later
    }
    return ERR_NONE;
}